

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

AssertionExpr *
slang::ast::AbortAssertionExpr::fromSyntax(AcceptOnPropertyExprSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  Compilation *this;
  int iVar2;
  Expression *expr;
  undefined4 extraout_var;
  AbortAssertionExpr *pAVar3;
  bool isSync;
  Action action;
  
  this = ((context->scope).ptr)->compilation;
  expr = bindExpr((syntax->condition).ptr,context,false,true);
  iVar2 = AssertionExpr::bind((AssertionExpr *)(syntax->expr).ptr,(int)context,(sockaddr *)0x0,0);
  TVar1 = (syntax->keyword).kind;
  if (TVar1 == SyncRejectOnKeyword) {
    action = Reject;
LAB_003ad050:
    isSync = true;
  }
  else {
    if (TVar1 == RejectOnKeyword) {
      action = Reject;
    }
    else {
      if (TVar1 == SyncAcceptOnKeyword) {
        action = Accept;
        goto LAB_003ad050;
      }
      action = Accept;
    }
    isSync = false;
  }
  AssertionExpr::checkSampledValueExpr(expr,context,false,(DiagCode)0x330008,(DiagCode)0x340008);
  pAVar3 = BumpAllocator::
           emplace<slang::ast::AbortAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&,slang::ast::AbortAssertionExpr::Action&,bool&>
                     (&this->super_BumpAllocator,expr,(AssertionExpr *)CONCAT44(extraout_var,iVar2),
                      &action,&isSync);
  return &pAVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& AbortAssertionExpr::fromSyntax(const AcceptOnPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& cond = bindExpr(*syntax.condition, context);
    auto& expr = bind(*syntax.expr, context);

    Action action;
    bool isSync;
    switch (syntax.keyword.kind) {
        case TokenKind::AcceptOnKeyword:
            action = Accept;
            isSync = false;
            break;
        case TokenKind::SyncAcceptOnKeyword:
            action = Accept;
            isSync = true;
            break;
        case TokenKind::RejectOnKeyword:
            action = Reject;
            isSync = false;
            break;
        case TokenKind::SyncRejectOnKeyword:
            action = Reject;
            isSync = true;
            break;
        default:
            SLANG_UNREACHABLE;
    }

    checkSampledValueExpr(cond, context, false, diag::PropAbortLocalVar, diag::PropAbortMatched);

    return *comp.emplace<AbortAssertionExpr>(cond, expr, action, isSync);
}